

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::handleTouchEvent(QWidgetWindow *this,QTouchEvent *event)

{
  Data *pDVar1;
  bool bVar2;
  QPointingDevice *device;
  QWidget *pQVar3;
  undefined8 extraout_RDX;
  
  if (*(short *)(event + 8) == 0xd1) {
    device = (QPointingDevice *)QPointerEvent::pointingDevice();
    QApplicationPrivate::translateTouchCancel(device,*(ulong *)(event + 0x18));
    event[0xc] = (QTouchEvent)0x1;
  }
  else {
    pQVar3 = QApplication::activePopupWidget();
    if (pQVar3 == (QWidget *)0x0) {
      pDVar1 = (this->m_widget).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QWidget *)0x0;
      }
      else {
        pQVar3 = (QWidget *)(this->m_widget).wp.value;
      }
      bVar2 = QApplicationPrivate::translateRawTouchEvent(pQVar3,event);
      (**(code **)(*(long *)event + 0x10))
                (event,bVar2,extraout_RDX,*(code **)(*(long *)event + 0x10));
      return;
    }
    event[0xc] = (QTouchEvent)0x0;
  }
  return;
}

Assistant:

void QWidgetWindow::handleTouchEvent(QTouchEvent *event)
{
    if (event->type() == QEvent::TouchCancel) {
        QApplicationPrivate::translateTouchCancel(event->pointingDevice(), event->timestamp());
        event->accept();
    } else if (QApplication::activePopupWidget()) {
        // Ignore touch events for popups. This will cause QGuiApplication to synthesise mouse
        // events instead, which QWidgetWindow::handleMouseEvent will forward correctly:
        event->ignore();
    } else {
        event->setAccepted(QApplicationPrivate::translateRawTouchEvent(m_widget, event));
    }
}